

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O2

void amrex::write_to_stderr_without_buffering(char *str)

{
  ostream *poVar1;
  size_t sVar2;
  __string_type tmp;
  ostringstream procall;
  
  fflush((FILE *)0x0);
  if (str != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&procall);
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostringstream *)&procall,*(int *)(ParallelContext::frames + 0xc));
    std::operator<<(poVar1,"::");
    std::__cxx11::stringbuf::str();
    sVar2 = strlen(tmp._M_dataplus._M_p);
    fwrite(tmp._M_dataplus._M_p,sVar2,1,_stderr);
    sVar2 = strlen(str);
    fwrite(str,sVar2,1,_stderr);
    fwrite(" !!!\n",5,1,_stderr);
    std::__cxx11::string::~string((string *)&tmp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&procall);
  }
  return;
}

Assistant:

void
amrex::write_to_stderr_without_buffering (const char* str)
{
    //
    // Flush all buffers.
    //
    fflush(NULL);

    if (str)
    {
        std::ostringstream procall;
        procall << ParallelDescriptor::MyProc() << "::";
        auto tmp = procall.str();
        const char *cprocall = tmp.c_str();
        const char * const end = " !!!\n";
        fwrite(cprocall, strlen(cprocall), 1, stderr);
        fwrite(str, strlen(str), 1, stderr);
        fwrite(end, strlen(end), 1, stderr);
    }
}